

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int getEndSurfaceHeight(int mc,uint64_t seed,int x,int z)

{
  int iVar1;
  double ncol11 [33];
  double ncol10 [33];
  double ncol01 [33];
  double ncol00 [33];
  double dz;
  double dx;
  int cellz;
  int cellx;
  SurfaceNoise sn;
  EndNoise en;
  uint64_t in_stack_ffffffffffffaed0;
  int in_stack_ffffffffffffaedc;
  undefined4 in_stack_ffffffffffffaee0;
  int in_stack_ffffffffffffaee4;
  int in_stack_ffffffffffffaee8;
  int in_stack_ffffffffffffaeec;
  EndNoise *in_stack_ffffffffffffaef0;
  SurfaceNoise *in_stack_ffffffffffffaef8;
  double *in_stack_ffffffffffffaf00;
  int in_stack_ffffffffffffaf10;
  double in_stack_ffffffffffffaf38;
  double in_stack_ffffffffffffaf40;
  int in_stack_ffffffffffffaf48;
  int in_stack_ffffffffffffaf4c;
  double *in_stack_ffffffffffffaf50;
  double *in_stack_ffffffffffffaf58;
  double *in_stack_ffffffffffffaf60;
  double *in_stack_ffffffffffffaf68;
  int in_stack_ffffffffffffaf80;
  
  setEndSeed((EndNoise *)CONCAT44(in_stack_ffffffffffffaee4,in_stack_ffffffffffffaee0),
             in_stack_ffffffffffffaedc,in_stack_ffffffffffffaed0);
  initSurfaceNoise((SurfaceNoise *)CONCAT44(in_stack_ffffffffffffaee4,in_stack_ffffffffffffaee0),
                   in_stack_ffffffffffffaedc,in_stack_ffffffffffffaed0);
  sampleNoiseColumnEnd
            (in_stack_ffffffffffffaf00,in_stack_ffffffffffffaef8,in_stack_ffffffffffffaef0,
             in_stack_ffffffffffffaeec,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee4,
             in_stack_ffffffffffffaf10);
  sampleNoiseColumnEnd
            (in_stack_ffffffffffffaf00,in_stack_ffffffffffffaef8,in_stack_ffffffffffffaef0,
             in_stack_ffffffffffffaeec,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee4,
             in_stack_ffffffffffffaf10);
  sampleNoiseColumnEnd
            (in_stack_ffffffffffffaf00,in_stack_ffffffffffffaef8,in_stack_ffffffffffffaef0,
             in_stack_ffffffffffffaeec,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee4,
             in_stack_ffffffffffffaf10);
  sampleNoiseColumnEnd
            (in_stack_ffffffffffffaf00,in_stack_ffffffffffffaef8,in_stack_ffffffffffffaef0,
             in_stack_ffffffffffffaeec,in_stack_ffffffffffffaee8,in_stack_ffffffffffffaee4,
             in_stack_ffffffffffffaf10);
  iVar1 = getSurfaceHeight(in_stack_ffffffffffffaf68,in_stack_ffffffffffffaf60,
                           in_stack_ffffffffffffaf58,in_stack_ffffffffffffaf50,
                           in_stack_ffffffffffffaf4c,in_stack_ffffffffffffaf48,
                           in_stack_ffffffffffffaf80,in_stack_ffffffffffffaf40,
                           in_stack_ffffffffffffaf38);
  return iVar1;
}

Assistant:

int getEndSurfaceHeight(int mc, uint64_t seed, int x, int z)
{
    EndNoise en;
    setEndSeed(&en, mc, seed);

    SurfaceNoise sn;
    initSurfaceNoise(&sn, DIM_END, seed);

    // end noise columns vary on a grid of cell size = eight
    int cellx = (x >> 3);
    int cellz = (z >> 3);
    double dx = (x & 7) / 8.0;
    double dz = (z & 7) / 8.0;

    // abusing enum for local compile time constants rather than enumeration
    enum { y0 = 0, y1 = 32, yn = y1-y0+1 };
    double ncol00[yn];
    double ncol01[yn];
    double ncol10[yn];
    double ncol11[yn];
    sampleNoiseColumnEnd(ncol00, &sn, &en, cellx, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol01, &sn, &en, cellx, cellz+1, y0, y1);
    sampleNoiseColumnEnd(ncol10, &sn, &en, cellx+1, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol11, &sn, &en, cellx+1, cellz+1, y0, y1);

    return getSurfaceHeight(ncol00, ncol01, ncol10, ncol11, y0, y1, 4, dx, dz);
}